

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DPIFaultObject.cpp
# Opt level: O2

void __thiscall
eipScanner::vendor::ra::powerFlex525::DPIFaultObject::DPIFaultObject
          (DPIFaultObject *this,CipUint instanceId,SPtr *si)

{
  SPtr local_30;
  
  std::make_shared<eipScanner::MessageRouter>();
  DPIFaultObject(this,instanceId,si,&local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<eipScanner::MessageRouter,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

DPIFaultObject::DPIFaultObject(CipUint instanceId, const SessionInfoIf::SPtr &si)
            : DPIFaultObject(instanceId, si, std::make_shared<MessageRouter>()) {

    }